

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultInputSkew(ClockingBlockSymbol *this)

{
  Scope *pSVar1;
  LookupLocation LVar2;
  ClockingSkew CVar3;
  ClockingSkewSyntax local_48;
  undefined8 uStack_20;
  undefined8 local_18;
  
  if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == true) {
    CVar3._4_4_ = 0;
    CVar3.edge = (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>
                 ._M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload.
                 _M_value.edge;
    CVar3.delay = (this->defaultInputSkew).
                  super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay;
  }
  else if (this->inputSkewSyntax == (ClockingSkewSyntax *)0x0) {
    *(undefined8 *)
     &(this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload = 0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay =
         (TimingControl *)0x0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    CVar3 = (ClockingSkew)ZEXT816(0);
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    if (pSVar1 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x4ee,"ClockingSkew slang::ast::ClockingBlockSymbol::getDefaultInputSkew() const")
      ;
    }
    LVar2 = LookupLocation::before(&this->super_Symbol);
    local_48.super_SyntaxNode.kind = LVar2.index;
    local_48.edge.kind = Unknown;
    local_48.edge._2_1_ = 0;
    local_48.edge.numFlags.raw = '\0';
    local_48.edge.rawLen = 0;
    local_48.edge.info = (Info *)0x0;
    local_48.delay = (TimingControlSyntax *)0x0;
    uStack_20 = 0;
    local_18 = 0;
    local_48.super_SyntaxNode.parent = (SyntaxNode *)pSVar1;
    if (LVar2.scope != pSVar1 && LVar2.scope != (Scope *)0x0) {
      assert::assertFailed
                ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                 ,0x119,
                 "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                );
    }
    CVar3 = ClockingSkew::fromSyntax((ClockingSkew *)this->inputSkewSyntax,&local_48,LVar2._8_8_);
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.edge = CVar3.edge;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay = CVar3.delay;
    if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == false) {
      (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    }
  }
  return CVar3;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultInputSkew() const {
    if (!defaultInputSkew) {
        if (inputSkewSyntax) {
            auto scope = getParentScope();
            ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultInputSkew = ClockingSkew::fromSyntax(*inputSkewSyntax, context);
        }
        else {
            defaultInputSkew.emplace();
        }
    }
    return *defaultInputSkew;
}